

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O1

void __thiscall
btAxisSweep3Internal<unsigned_short>::sortMaxUp
          (btAxisSweep3Internal<unsigned_short> *this,int axis,unsigned_short edge,
          btDispatcher *param_3,bool updateOverlaps)

{
  short *psVar1;
  ushort uVar2;
  Handle *pHVar3;
  btOverlappingPairCallback *pbVar4;
  ushort uVar5;
  ulong uVar6;
  uint uVar7;
  undefined6 in_register_00000012;
  unsigned_short *puVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  
  lVar9 = (long)axis;
  uVar6 = CONCAT62(in_register_00000012,edge) & 0xffffffff;
  uVar5 = this->m_pEdges[lVar9][uVar6 + 1].m_handle;
  if (uVar5 != 0) {
    puVar8 = &this->m_pEdges[lVar9][uVar6].m_handle;
    uVar2 = *puVar8;
    uVar10 = 1 << ((byte)axis & 0x1f) & 3;
    pHVar3 = this->m_pHandles;
    uVar7 = 1 << (sbyte)uVar10 & 3;
    do {
      if (((Edge *)(puVar8 + -1))->m_pos < puVar8[1]) {
        return;
      }
      lVar11 = (long)(this->m_pHandles->super_btBroadphaseProxy).m_aabbMin.m_floats +
               ((ulong)((uint)uVar5 * 0x50) - 0x1c);
      bVar14 = (puVar8[1] & 1) == 0;
      lVar13 = 0x42;
      if (bVar14) {
        lVar13 = 0x3c;
      }
      if ((((bVar14 && updateOverlaps) &&
           (lVar13 = 0x3c,
           *(ushort *)(lVar11 + 0x3c + (ulong)(uVar10 * 2)) <=
           *(ushort *)((long)pHVar3->m_maxEdges + (ulong)(uVar10 * 2) + (ulong)((uint)uVar2 * 0x50))
           )) && (*(ushort *)
                   ((long)(&(pHVar3->super_btBroadphaseProxy).m_aabbMax + 1) +
                   (ulong)(uVar10 * 2) + (ulong)((uint)uVar2 * 0x50)) <=
                  *(ushort *)(lVar11 + 0x42 + (ulong)(uVar10 * 2)))) &&
         ((uVar6 = (ulong)(uVar7 * 2),
          *(ushort *)(lVar11 + 0x3c + uVar6) <=
          *(ushort *)((long)pHVar3->m_maxEdges + uVar6 + (uint)uVar2 * 0x50) &&
          (uVar6 = (ulong)(uVar7 * 2),
          *(ushort *)
           ((long)(&(pHVar3->super_btBroadphaseProxy).m_aabbMax + 1) + uVar6 + (uint)uVar2 * 0x50)
          <= *(ushort *)(lVar11 + 0x42 + uVar6))))) {
        lVar12 = (long)(this->m_pHandles->super_btBroadphaseProxy).m_aabbMin.m_floats +
                 ((ulong)((uint)*puVar8 * 0x50) - 0x1c);
        (*(this->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback[2])
                  (this->m_pairCache,lVar12,lVar11);
        pbVar4 = this->m_userPairCallback;
        if (pbVar4 != (btOverlappingPairCallback *)0x0) {
          (*pbVar4->_vptr_btOverlappingPairCallback[2])(pbVar4,lVar12,lVar11);
        }
      }
      psVar1 = (short *)(lVar11 + lVar13 + lVar9 * 2);
      *psVar1 = *psVar1 + -1;
      psVar1 = (short *)((long)pHVar3->m_maxEdges + lVar9 * 2 + (ulong)((uint)uVar2 * 0x50));
      *psVar1 = *psVar1 + 1;
      *(ulong *)(puVar8 + -1) =
           CONCAT44((int)*(undefined8 *)(puVar8 + -1),
                    (int)((ulong)*(undefined8 *)(puVar8 + -1) >> 0x20));
      uVar5 = puVar8[4];
      puVar8 = puVar8 + 2;
    } while (uVar5 != 0);
  }
  return;
}

Assistant:

void btAxisSweep3Internal<BP_FP_INT_TYPE>::sortMaxUp(int axis, BP_FP_INT_TYPE edge, btDispatcher* /* dispatcher */, bool updateOverlaps)
{
	Edge* pEdge = m_pEdges[axis] + edge;
	Edge* pNext = pEdge + 1;
	Handle* pHandleEdge = getHandle(pEdge->m_handle);

	while (pNext->m_handle && (pEdge->m_pos >= pNext->m_pos))
	{
		Handle* pHandleNext = getHandle(pNext->m_handle);

		const int axis1 = (1  << axis) & 3;
		const int axis2 = (1  << axis1) & 3;

		if (!pNext->IsMax())
		{
			// if next edge is a minimum check the bounds and add an overlap if necessary
			if (updateOverlaps && testOverlap2D(pHandleEdge, pHandleNext,axis1,axis2))
			{
				Handle* handle0 = getHandle(pEdge->m_handle);
				Handle* handle1 = getHandle(pNext->m_handle);
				m_pairCache->addOverlappingPair(handle0,handle1);
				if (m_userPairCallback)
					m_userPairCallback->addOverlappingPair(handle0,handle1);
			}

			// update edge reference in other handle
			pHandleNext->m_minEdges[axis]--;
		}
		else
			pHandleNext->m_maxEdges[axis]--;

		pHandleEdge->m_maxEdges[axis]++;

		// swap the edges
		Edge swap = *pEdge;
		*pEdge = *pNext;
		*pNext = swap;

		// increment
		pEdge++;
		pNext++;
	}
	
}